

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O0

Fxu_Matrix * Fxu_CreateMatrix(Fxu_Data_t *pData)

{
  int iVar1;
  char *pcVar2;
  Vec_Int_t *vFanins_00;
  int iVar3;
  int iVar4;
  Fxu_Var **ppFVar5;
  Fxu_Var *pFVar6;
  Fxu_Pair ***pppFVar7;
  Fxu_Pair **ppFVar8;
  int *pOrder_00;
  Fxu_Cube *pCube;
  Fxu_Cube *local_a8;
  double Density;
  int local_90;
  int nFanins;
  int iPair;
  int iCube;
  int nCubes;
  int nPairsStore;
  int nPairsTotal;
  int nCubesTotal;
  int c;
  int v;
  int i;
  int nBitsMax;
  int *pOrder;
  char *pSopCube;
  char *pSopCover;
  Vec_Int_t *vFanins;
  Fxu_Cube *pCube2;
  Fxu_Cube *pCube1;
  Fxu_Cube *pCubeNew;
  Fxu_Cube *pCubeFirst;
  Fxu_Var *pVar;
  Fxu_Matrix *p;
  Fxu_Data_t *pData_local;
  
  nPairsStore = 0;
  nCubes = 0;
  iCube = 0;
  v = -1;
  for (c = 0; c < pData->nNodesOld; c = c + 1) {
    pcVar2 = (char *)pData->vSops->pArray[c];
    if (pcVar2 != (char *)0x0) {
      iVar3 = Abc_SopGetCubeNum(pcVar2);
      iVar4 = Abc_SopGetVarNum(pcVar2);
      if ((iVar4 < 2) || (iVar3 < 1)) {
        __assert_fail("nFanins > 1 && nCubes > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                      ,0x50,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
      }
      nPairsStore = iVar3 + nPairsStore;
      nCubes = (iVar3 * (iVar3 + -1)) / 2 + nCubes;
      iCube = iVar3 * iVar3 + iCube;
      if (v < iVar4) {
        v = iVar4;
      }
    }
  }
  if (v < 1) {
    printf("The current network does not have SOPs to perform extraction.\n");
    pData_local = (Fxu_Data_t *)0x0;
  }
  else if (iCube < 0x2faf081) {
    pData_local = (Fxu_Data_t *)Fxu_MatrixAllocate();
    ppFVar5 = (Fxu_Var **)malloc((long)((pData->nNodesOld + pData->nNodesExt) * 2) << 3);
    ((Fxu_Matrix *)pData_local)->ppVars = ppFVar5;
    for (c = 0; SBORROW4(c,pData->nNodesOld * 2) != c + pData->nNodesOld * -2 < 0; c = c + 1) {
      pFVar6 = Fxu_MatrixAddVar((Fxu_Matrix *)pData_local);
      ((Fxu_Matrix *)pData_local)->ppVars[c] = pFVar6;
    }
    pppFVar7 = (Fxu_Pair ***)malloc((long)(nPairsStore + 100) << 3);
    ((Fxu_Matrix *)pData_local)->pppPairs = pppFVar7;
    ppFVar8 = (Fxu_Pair **)malloc((long)(iCube + 100) << 3);
    ((Fxu_Matrix *)pData_local)->ppPairs = ppFVar8;
    memset(((Fxu_Matrix *)pData_local)->ppPairs,0,(long)iCube << 3);
    nFanins = 0;
    local_90 = 0;
    for (c = 0; c < pData->nNodesOld; c = c + 1) {
      pcVar2 = (char *)pData->vSops->pArray[c];
      if (pcVar2 != (char *)0x0) {
        iVar3 = Abc_SopGetCubeNum(pcVar2);
        pFVar6 = ((Fxu_Matrix *)pData_local)->ppVars[c * 2 + 1];
        pFVar6->nCubes = iVar3;
        if (0 < iVar3) {
          pFVar6->ppPairs = ((Fxu_Matrix *)pData_local)->pppPairs + nFanins;
          *pFVar6->ppPairs = ((Fxu_Matrix *)pData_local)->ppPairs + local_90;
          for (nCubesTotal = 1; nCubesTotal < iVar3; nCubesTotal = nCubesTotal + 1) {
            pFVar6->ppPairs[nCubesTotal] = pFVar6->ppPairs[nCubesTotal + -1] + iVar3;
          }
        }
        nFanins = iVar3 + nFanins;
        local_90 = iVar3 * iVar3 + local_90;
      }
    }
    if (nFanins != nPairsStore) {
      __assert_fail("iCube == nCubesTotal",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                    ,0x85,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
    }
    if (local_90 != iCube) {
      __assert_fail("iPair == nPairsStore",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                    ,0x86,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
    }
    pOrder_00 = (int *)malloc((long)v << 2);
    for (c = 0; c < pData->nNodesOld; c = c + 1) {
      pOrder = (int *)pData->vSops->pArray[c];
      if (pOrder != (int *)0x0) {
        pFVar6 = ((Fxu_Matrix *)pData_local)->ppVars[c * 2 + 1];
        vFanins_00 = (Vec_Int_t *)pData->vFanins->pArray[c];
        s_pLits = vFanins_00->pArray;
        iVar3 = Abc_SopGetVarNum((char *)pOrder);
        for (nCubesTotal = 0; nCubesTotal < iVar3; nCubesTotal = nCubesTotal + 1) {
          pOrder_00[nCubesTotal] = nCubesTotal;
        }
        qsort(pOrder_00,(long)iVar3,4,Fxu_CreateMatrixLitCompare);
        if (s_pLits[pOrder_00[iVar3 + -1]] <= s_pLits[*pOrder_00]) {
          __assert_fail("s_pLits[ pOrder[0] ] < s_pLits[ pOrder[nFanins-1] ]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                        ,0x9c,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
        }
        pCubeNew = (Fxu_Cube *)0x0;
        nPairsTotal = 0;
        for (; (char)*pOrder != '\0'; pOrder = (int *)((long)pOrder + (long)(iVar3 + 3))) {
          pCube = Fxu_MatrixAddCube((Fxu_Matrix *)pData_local,pFVar6,nPairsTotal);
          Fxu_CreateMatrixAddCube
                    ((Fxu_Matrix *)pData_local,pCube,(char *)pOrder,vFanins_00,pOrder_00);
          if (pCubeNew == (Fxu_Cube *)0x0) {
            pCubeNew = pCube;
          }
          pCube->pFirst = pCubeNew;
          nPairsTotal = nPairsTotal + 1;
        }
        pFVar6->pFirst = pCubeNew;
        if (nCubes <= pData->nPairsMax) {
          for (pCube2 = pCubeNew; pCube2 != (Fxu_Cube *)0x0; pCube2 = pCube2->pNext) {
            if (pCube2 == (Fxu_Cube *)0x0) {
              local_a8 = (Fxu_Cube *)0x0;
            }
            else {
              local_a8 = pCube2->pNext;
            }
            for (vFanins = (Vec_Int_t *)local_a8; vFanins != (Vec_Int_t *)0x0;
                vFanins = (Vec_Int_t *)vFanins[3].pArray) {
              Fxu_MatrixAddDivisor((Fxu_Matrix *)pData_local,pCube2,(Fxu_Cube *)vFanins);
            }
          }
        }
      }
    }
    if (pOrder_00 != (int *)0x0) {
      free(pOrder_00);
    }
    if (nCubes < 0x989681) {
      if ((pData->nPairsMax < nCubes) &&
         (iVar3 = Fxu_PreprocessCubePairs
                            ((Fxu_Matrix *)pData_local,pData->vSops,nCubes,pData->nPairsMax),
         iVar3 == 0)) {
        pData_local = (Fxu_Data_t *)0x0;
      }
      else if ((((Fxu_Matrix *)pData_local)->lVars).nItems < 0xf4241) {
        Fxu_MatrixComputeSingles((Fxu_Matrix *)pData_local,pData->fUse0,pData->nSingleMax);
        if (pData->fVerbose != 0) {
          iVar3 = ((Fxu_Matrix *)pData_local)->nEntries;
          iVar4 = (((Fxu_Matrix *)pData_local)->lVars).nItems;
          iVar1 = (((Fxu_Matrix *)pData_local)->lCubes).nItems;
          fprintf(_stdout,"Matrix: [vars x cubes] = [%d x %d]  ",
                  (ulong)(uint)(((Fxu_Matrix *)pData_local)->lVars).nItems,
                  (ulong)(uint)(((Fxu_Matrix *)pData_local)->lCubes).nItems);
          fprintf(_stdout,"Lits = %d  Density = %.5f%%\n",
                  ((double)iVar3 / (double)iVar4) / (double)iVar1,
                  (ulong)(uint)((Fxu_Matrix *)pData_local)->nEntries);
          fprintf(_stdout,"1-cube divs = %6d. (Total = %6d)  ",
                  (ulong)(uint)(((Fxu_Matrix *)pData_local)->lSingles).nItems,
                  (ulong)(uint)((Fxu_Matrix *)pData_local)->nSingleTotal);
          fprintf(_stdout,"2-cube divs = %6d. (Total = %6d)",
                  (ulong)(uint)((Fxu_Matrix *)pData_local)->nDivsTotal,(ulong)(uint)nCubes);
          fprintf(_stdout,"\n");
        }
      }
      else {
        printf("The total number of variables is more than 1,000,000.\n");
        printf("Command \"fx\" takes a long time to run in such cases. It is suggested\n");
        printf("that the user changes the network by reducing the size of logic node and\n");
        printf("consequently the number of cube pairs to be processed by this command.\n");
        printf("It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n")
        ;
        printf("as a proprocessing step, while selecting <num> as approapriate.\n");
        pData_local = (Fxu_Data_t *)0x0;
      }
    }
    else {
      printf("The total number of cube pairs of the network is more than 10,000,000.\n");
      printf("Command \"fx\" takes a long time to run in such cases. It is suggested\n");
      printf("that the user changes the network by reducing the size of logic node and\n");
      printf("consequently the number of cube pairs to be processed by this command.\n");
      printf("It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n");
      printf("as a proprocessing step, while selecting <num> as approapriate.\n");
      pData_local = (Fxu_Data_t *)0x0;
    }
  }
  else {
    printf("The problem is too large to be solved by \"fxu\" (%d cubes and %d cube pairs)\n",
           (ulong)(uint)nPairsStore,(ulong)(uint)iCube);
    pData_local = (Fxu_Data_t *)0x0;
  }
  return (Fxu_Matrix *)pData_local;
}

Assistant:

Fxu_Matrix * Fxu_CreateMatrix( Fxu_Data_t * pData )
{
    Fxu_Matrix * p;
    Fxu_Var * pVar;
    Fxu_Cube * pCubeFirst, * pCubeNew;
    Fxu_Cube * pCube1, * pCube2;
    Vec_Int_t * vFanins;
    char * pSopCover;
    char * pSopCube;
    int * pOrder, nBitsMax;
    int i, v, c;
    int nCubesTotal;
    int nPairsTotal;
    int nPairsStore;
    int nCubes;
    int iCube, iPair;
    int nFanins;

    // collect all sorts of statistics
    nCubesTotal =  0;
    nPairsTotal =  0;
    nPairsStore =  0;
    nBitsMax    = -1; 
    for ( i = 0; i < pData->nNodesOld; i++ )
        if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
        {
            nCubes       = Abc_SopGetCubeNum( pSopCover );
            nFanins      = Abc_SopGetVarNum( pSopCover );
            assert( nFanins > 1 && nCubes > 0 );

            nCubesTotal += nCubes;
            nPairsTotal += nCubes * (nCubes - 1) / 2;
            nPairsStore += nCubes * nCubes;
            if ( nBitsMax < nFanins )
                nBitsMax = nFanins;
        }
    if ( nBitsMax <= 0 )
    {
        printf( "The current network does not have SOPs to perform extraction.\n" );
        return NULL;
    }

    if ( nPairsStore > 50000000 )
    {
        printf( "The problem is too large to be solved by \"fxu\" (%d cubes and %d cube pairs)\n", nCubesTotal, nPairsStore );
        return NULL;
    }

    // start the matrix
	p = Fxu_MatrixAllocate();
    // create the column labels 
    p->ppVars = ABC_ALLOC( Fxu_Var *, 2 * (pData->nNodesOld + pData->nNodesExt) );
    for ( i = 0; i < 2 * pData->nNodesOld; i++ )
        p->ppVars[i] = Fxu_MatrixAddVar( p );

    // allocate storage for all cube pairs at once
    p->pppPairs = ABC_ALLOC( Fxu_Pair **, nCubesTotal + 100 );
    p->ppPairs  = ABC_ALLOC( Fxu_Pair *,  nPairsStore + 100 );
    memset( p->ppPairs, 0, sizeof(Fxu_Pair *) * nPairsStore );
    iCube = 0;
    iPair = 0;
    for ( i = 0; i < pData->nNodesOld; i++ )
        if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
        {
            // get the number of cubes
            nCubes = Abc_SopGetCubeNum( pSopCover );
            // get the new var in the matrix
            pVar = p->ppVars[2*i+1];
            // assign the pair storage
            pVar->nCubes     = nCubes;
            if ( nCubes > 0 )
            {
                pVar->ppPairs    = p->pppPairs + iCube;
                pVar->ppPairs[0] = p->ppPairs  + iPair;
                for ( v = 1; v < nCubes; v++ )
                    pVar->ppPairs[v] = pVar->ppPairs[v-1] + nCubes;
            }
            // update
            iCube += nCubes;
            iPair += nCubes * nCubes;
        }
    assert( iCube == nCubesTotal );
    assert( iPair == nPairsStore );


    // allocate room for the reordered literals
    pOrder = ABC_ALLOC( int, nBitsMax );
    // create the rows
    for ( i = 0; i < pData->nNodesOld; i++ )
    if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
    {
        // get the new var in the matrix
        pVar = p->ppVars[2*i+1];
        // here we sort the literals of the cover
        // in the increasing order of the numbers of the corresponding nodes
        // because literals should be added to the matrix in this order
        vFanins = (Vec_Int_t *)pData->vFanins->pArray[i];
        s_pLits = vFanins->pArray;
        // start the variable order
        nFanins = Abc_SopGetVarNum( pSopCover );
        for ( v = 0; v < nFanins; v++ )
            pOrder[v] = v;
        // reorder the fanins
        qsort( (void *)pOrder, nFanins, sizeof(int),(int (*)(const void *, const void *))Fxu_CreateMatrixLitCompare);
        assert( s_pLits[ pOrder[0] ] < s_pLits[ pOrder[nFanins-1] ] );
        // create the corresponding cubes in the matrix
        pCubeFirst = NULL;
        c = 0;
        Abc_SopForEachCube( pSopCover, nFanins, pSopCube )
        {
            // create the cube
	        pCubeNew = Fxu_MatrixAddCube( p, pVar, c++ );
            Fxu_CreateMatrixAddCube( p, pCubeNew, pSopCube, vFanins, pOrder );
            if ( pCubeFirst == NULL )
                pCubeFirst = pCubeNew;
            pCubeNew->pFirst = pCubeFirst;
        }
        // set the first cube of this var
        pVar->pFirst = pCubeFirst;
        // create the divisors without preprocessing
        if ( nPairsTotal <= pData->nPairsMax )
        {
		    for ( pCube1 = pCubeFirst; pCube1; pCube1 = pCube1->pNext )
			    for ( pCube2 = pCube1? pCube1->pNext: NULL; pCube2; pCube2 = pCube2->pNext )
				    Fxu_MatrixAddDivisor( p, pCube1, pCube2 );
        }
    }
    ABC_FREE( pOrder );

    // consider the case when cube pairs should be preprocessed
    // before adding them to the set of divisors
//    if ( pData->fVerbose )
//        printf( "The total number of cube pairs is %d.\n", nPairsTotal );
    if ( nPairsTotal > 10000000 )
    {
        printf( "The total number of cube pairs of the network is more than 10,000,000.\n" );
        printf( "Command \"fx\" takes a long time to run in such cases. It is suggested\n" );
        printf( "that the user changes the network by reducing the size of logic node and\n" );
        printf( "consequently the number of cube pairs to be processed by this command.\n" );
        printf( "It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n" );
        printf( "as a proprocessing step, while selecting <num> as approapriate.\n" );
        return NULL;
    }
    if ( nPairsTotal > pData->nPairsMax )
        if ( !Fxu_PreprocessCubePairs( p, pData->vSops, nPairsTotal, pData->nPairsMax ) )
            return NULL;
//    if ( pData->fVerbose )
//        printf( "Only %d best cube pairs will be used by the fast extract command.\n", pData->nPairsMax );

    if ( p->lVars.nItems > 1000000 )
    {
        printf( "The total number of variables is more than 1,000,000.\n" );
        printf( "Command \"fx\" takes a long time to run in such cases. It is suggested\n" );
        printf( "that the user changes the network by reducing the size of logic node and\n" );
        printf( "consequently the number of cube pairs to be processed by this command.\n" );
        printf( "It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n" );
        printf( "as a proprocessing step, while selecting <num> as approapriate.\n" );
        return NULL;
    }


    // add the var pairs to the heap
    Fxu_MatrixComputeSingles( p, pData->fUse0, pData->nSingleMax );

    // print stats
    if ( pData->fVerbose )
    {
        double Density;
        Density = ((double)p->nEntries) / p->lVars.nItems / p->lCubes.nItems;
	    fprintf( stdout, "Matrix: [vars x cubes] = [%d x %d]  ",
            p->lVars.nItems, p->lCubes.nItems );
	    fprintf( stdout, "Lits = %d  Density = %.5f%%\n", 
            p->nEntries, Density );
	    fprintf( stdout, "1-cube divs = %6d. (Total = %6d)  ",  p->lSingles.nItems, p->nSingleTotal );
	    fprintf( stdout, "2-cube divs = %6d. (Total = %6d)",  p->nDivsTotal, nPairsTotal );
	    fprintf( stdout, "\n" );
    }
//    Fxu_MatrixPrint( stdout, p );
    return p;
}